

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O2

void __thiscall timing_registry::registerTask(timing_registry *this,uint64_t uid,string *name)

{
  int64_t iVar1;
  mapped_type *pmVar2;
  uint64_t local_28;
  
  local_28 = uid;
  iVar1 = query_performance_counter();
  std::recursive_mutex::lock(&this->m);
  pmVar2 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_timing_registry::task_info>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_timing_registry::task_info>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->tasks,&local_28);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  pmVar2->createdAt = iVar1;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void registerTask(uint64_t uid, const std::string &name)
    {
        auto t = query_performance_counter();
        std::lock_guard<std::recursive_mutex> __l(m);
        auto &h = tasks[uid];
        h.name = name;
        h.createdAt = t;
    }